

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O0

void __thiscall Clasp::ClaspStatistics::Impl::visit(Impl *this,StatisticObject *obj,KeySet *visited)

{
  bool bVar1;
  uint i_00;
  uint32 uVar2;
  _Node_iterator_base<unsigned_long,_false> visited_00;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_RDX;
  Impl *in_RSI;
  StatisticObject *in_RDI;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar3;
  uint32 end_1;
  uint32 i_1;
  uint32 end;
  uint32 i;
  iterator it;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffff70;
  byte local_79;
  uint32 local_6c;
  uint32 local_58;
  Statistics_t local_54;
  _Node_iterator_base<unsigned_long,_false> local_50;
  byte local_48;
  _Node_iterator_base<unsigned_long,_false> local_40;
  byte local_38;
  _Node_iterator_base<unsigned_long,_false> local_30;
  uint64 local_28;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *obj_00;
  
  local_28 = StatisticObject::toRep((StatisticObject *)in_RSI);
  visited_00._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
       ::find(in_stack_ffffffffffffff58,(key_type *)0x20b043);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
       ::end(in_stack_ffffffffffffff58);
  bVar1 = std::__detail::operator==
                    ((_Node_iterator_base<unsigned_long,_false> *)&stack0xffffffffffffffe0,&local_30
                    );
  local_79 = 1;
  obj_00 = in_RDX;
  if (!bVar1) {
    std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
              ((_Node_iterator<unsigned_long,_true,_false> *)0x20b093);
    pVar3 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::insert(in_RDX,(value_type *)
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_50._M_cur =
         (__node_type *)pVar3.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
    local_48 = pVar3.second;
    local_79 = local_48 ^ 0xff;
    in_stack_ffffffffffffff70 = in_RDX;
    local_40._M_cur = local_50._M_cur;
    local_38 = local_48;
  }
  if ((local_79 & 1) == 0) {
    local_54.val_ = (E)StatisticObject::type((StatisticObject *)in_stack_ffffffffffffff58);
    i_00 = Potassco::Statistics_t::operator_cast_to_unsigned_int(&local_54);
    if (i_00 == 2) {
      local_6c = 0;
      uVar2 = StatisticObject::size(in_RDI);
      for (; local_6c != uVar2; local_6c = local_6c + 1) {
        StatisticObject::operator[]
                  ((StatisticObject *)CONCAT44(i_00,in_stack_ffffffffffffff68),
                   (uint32)((ulong)in_stack_ffffffffffffff60 >> 0x20));
        visit(in_RSI,(StatisticObject *)obj_00,(KeySet *)visited_00._M_cur);
      }
    }
    else if (i_00 == 3) {
      local_58 = 0;
      uVar2 = StatisticObject::size(in_RDI);
      for (; local_58 != uVar2; local_58 = local_58 + 1) {
        StatisticObject::key((StatisticObject *)in_stack_ffffffffffffff70,i_00);
        StatisticObject::at(in_RDI,(char *)in_stack_ffffffffffffff70);
        visit(in_RSI,(StatisticObject *)obj_00,(KeySet *)visited_00._M_cur);
      }
    }
  }
  return;
}

Assistant:

void visit(const StatisticObject& obj, KeySet& visited) {
		KeySet::iterator it = objects_.find(obj.toRep());
		if (it == objects_.end() || !visited.insert(*it).second) { return; }
		switch (obj.type()) {
			case Potassco::Statistics_t::Map:
				for (uint32 i = 0, end = obj.size(); i != end; ++i) { visit(obj.at(obj.key(i)), visited); }
				break;
			case Potassco::Statistics_t::Array:
				for (uint32 i = 0, end = obj.size(); i != end; ++i) { visit(obj[i], visited); }
				break;
			default: break;
		}
	}